

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetPropDelay(Wln_Ret_t *p)

{
  int iVar1;
  Wln_Ntk_t *pWVar2;
  int *__ptr;
  int iVar3;
  int iObj;
  long lVar4;
  
  (p->vSinks).nSize = 0;
  pWVar2 = p->pNtk;
  iVar3 = 0;
  if (1 < (pWVar2->vTypes).nSize) {
    iVar3 = 0;
    lVar4 = 1;
    do {
      if ((pWVar2->vTypes).pArray[lVar4] - 5U < 0xfffffffe) {
        iObj = (int)lVar4;
        iVar1 = Wln_RetPropDelay_rec(p,iObj);
        if (iVar3 == iVar1) {
          Vec_IntPush(&p->vSinks,iObj);
        }
        else if (iVar3 < iVar1) {
          __ptr = (p->vSinks).pArray;
          if ((p->vSinks).nCap < 1) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(4);
            }
            else {
              __ptr = (int *)realloc(__ptr,4);
            }
            (p->vSinks).pArray = __ptr;
            if (__ptr == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (p->vSinks).nCap = 1;
          }
          *__ptr = iObj;
          (p->vSinks).nSize = 1;
          iVar3 = iVar1;
        }
      }
      lVar4 = lVar4 + 1;
      pWVar2 = p->pNtk;
    } while (lVar4 < (pWVar2->vTypes).nSize);
  }
  return iVar3;
}

Assistant:

int Wln_RetPropDelay( Wln_Ret_t * p )
{
    int iObj, DelayMax = 0;
    Vec_IntClear( &p->vSinks );
    Wln_NtkForEachObj( p->pNtk, iObj )
        if ( !Wln_ObjIsCio(p->pNtk, iObj) )
        {
            int Delay = Wln_RetPropDelay_rec(p, iObj);
            if ( DelayMax == Delay )
                Vec_IntPush( &p->vSinks, iObj );
            else if ( DelayMax < Delay )
            {
                DelayMax = Delay;
                Vec_IntFill( &p->vSinks, 1, iObj );
            }
        }

//    Vec_IntForEachEntry( &p->vPathDelays, iObj, i )
//        printf( "Obj = %d.  Delay = %d.\n", i, iObj );
//    printf( "\n" );

//    printf( "Sinks: " );
//    Vec_IntPrint( &p->vSinks );

    return DelayMax;
}